

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::pred_per_update_feature<false,true,1ul,0ul,2ul,true>(norm_data *nd,float x,float *fw)

{
  undefined8 uVar1;
  float *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  stringstream __msg;
  float x2;
  weight *w;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  power_data *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  vw_exception *in_stack_fffffffffffffe40;
  stringstream local_1b0 [16];
  ostream local_1a0;
  float local_24;
  float *local_20;
  float local_c;
  float *local_8;
  
  local_24 = in_XMM0_Da * in_XMM0_Da;
  local_c = in_XMM0_Da;
  if (local_24 < 1.175494e-38) {
    local_c = (float)(~-(uint)(0.0 < in_XMM0_Da) & 0x9ffffffd |
                     -(uint)(0.0 < in_XMM0_Da) & 0x1ffffffd);
    local_24 = 1.175494e-38;
  }
  if (3.4028235e+38 < local_24) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::operator<<(&local_1a0,"your features have too much magnitude");
    uVar1 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
               in_stack_fffffffffffffe28);
    __cxa_throw(uVar1,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  in_RDI[5] = *in_RSI;
  in_RDI[6] = in_RSI[1];
  in_RDI[5] = *in_RSI;
  local_20 = in_RDI + 5;
  in_RDI[6] = *in_RDI * local_24 + in_RDI[6];
  local_8 = in_RDI;
  fVar2 = compute_rate_decay<false,1ul,0ul>
                    (in_stack_fffffffffffffe20,
                     (float *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  local_20[2] = fVar2;
  local_8[1] = local_24 * local_20[2] + local_8[1];
  return;
}

Assistant:

inline void pred_per_update_feature(norm_data& nd, float x, float& fw)
{
  if (feature_mask_off || fw != 0.)
  {
    weight* w = &fw;
    float x2 = x * x;
    if (x2 < x2_min)
    {
      x = (x > 0) ? x_min : -x_min;
      x2 = x2_min;
    }
    if (x2 > x2_max)
      THROW("your features have too much magnitude");
    if (stateless)  // we must not modify the parameter state so introduce a shadow version.
    {
      nd.extra_state[0] = w[0];
      nd.extra_state[adaptive] = w[adaptive];
      nd.extra_state[normalized] = w[normalized];
      w = nd.extra_state;
    }
    if (adaptive)
      w[adaptive] += nd.grad_squared * x2;
    if (normalized)
    {
      float x_abs = fabsf(x);
      if (x_abs > w[normalized])  // new scale discovered
      {
        if (w[normalized] >
            0.)  // If the normalizer is > 0 then rescale the weight so it's as if the new scale was the old scale.
        {
          if (sqrt_rate)
          {
            float rescale = w[normalized] / x_abs;
            w[0] *= (adaptive ? rescale : rescale * rescale);
          }
          else
          {
            float rescale = x_abs / w[normalized];
            w[0] *= powf(rescale * rescale, nd.pd.neg_norm_power);
          }
        }
        w[normalized] = x_abs;
      }
      nd.norm_x += x2 / (w[normalized] * w[normalized]);
    }
    w[spare] = compute_rate_decay<sqrt_rate, adaptive, normalized>(nd.pd, w[0]);
    nd.pred_per_update += x2 * w[spare];
  }
}